

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  XmlWriter *this_00;
  int iVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  allocator local_ec;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  LazyStat<Catch::TestCaseInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestCaseInfo,testInfo);
  this_00 = &this->m_xml;
  std::__cxx11::string::string((string *)&local_48,"TestCase",&local_e9);
  XmlWriter::startElement(this_00,&local_48,Newline|Indent);
  std::__cxx11::string::string((string *)&local_68,"name",&local_ea);
  trim(&local_88,&testInfo->name);
  XmlWriter::writeAttribute(this_00,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8,"description",&local_eb);
  XmlWriter::writeAttribute(this_00,&local_a8,&testInfo->description);
  std::__cxx11::string::string((string *)&local_c8,"tags",&local_ec);
  TestCaseInfo::tagsAsString_abi_cxx11_(&local_e8,testInfo);
  XmlWriter::writeAttribute(this_00,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  writeSourceInfo(this,&testInfo->lineInfo);
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    uVar2 = std::chrono::_V2::system_clock::now();
    (this->m_testCaseTimer).m_nanoseconds = uVar2;
  }
  XmlWriter::ensureTagClosed(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testCaseStarting( TestCaseInfo const& testInfo ) {
        StreamingReporterBase::testCaseStarting(testInfo);
        m_xml.startElement( "TestCase" )
            .writeAttribute( "name", trim( testInfo.name ) )
            .writeAttribute( "description", testInfo.description )
            .writeAttribute( "tags", testInfo.tagsAsString() );

        writeSourceInfo( testInfo.lineInfo );

        if ( m_config->showDurations() == ShowDurations::Always )
            m_testCaseTimer.start();
        m_xml.ensureTagClosed();
    }